

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<long_long>::resize(QList<long_long> *this,qsizetype size)

{
  longlong *plVar1;
  Data *pDVar2;
  long lVar3;
  longlong *plVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<long_long>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(longlong **)0x0,
               (QArrayDataPointer<long_long> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar3 = (this->d).size;
  if (lVar3 < size) {
    plVar4 = (this->d).ptr;
    plVar1 = plVar4 + lVar3;
    *plVar1 = 0;
    if (plVar1 + 1 != plVar4 + size) {
      memset(plVar1 + 1,0,(size * 8 + lVar3 * -8) - 8);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }